

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

void __thiscall
cppcms::crypto::openssl_aes_encryptor::set_iv(openssl_aes_encryptor *this,void *ptr,size_t size)

{
  undefined8 uVar1;
  size_t in_RDX;
  void *in_RSI;
  string *in_RDI;
  undefined3 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  allocator local_39;
  string local_38 [32];
  size_t local_18;
  void *local_10;
  
  if (in_RDX != 0x10) {
    uVar2 = CONCAT13(1,in_stack_ffffffffffffffb0);
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"cppcms::crypto::aes: Invalid IV size",&local_39);
    booster::invalid_argument::invalid_argument
              ((invalid_argument *)CONCAT44(in_stack_ffffffffffffffb4,uVar2),in_RDI);
    __cxa_throw(uVar1,&booster::invalid_argument::typeinfo,
                booster::invalid_argument::~invalid_argument);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  memcpy(&in_RDI[0x10].field_0x4,in_RSI,0x10);
  memcpy((void *)((long)&in_RDI[0x10].field_2 + 4),local_10,local_18);
  in_RDI[0x11].field_0x6 = 1;
  return;
}

Assistant:

void set_iv(void const *ptr,size_t size)
		{
			if(size != sizeof(iv_enc_))
				throw booster::invalid_argument("cppcms::crypto::aes: Invalid IV size");
			memcpy(iv_enc_,ptr,size);
			memcpy(iv_dec_,ptr,size);
			iv_initialized_ = true;
		}